

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Erase_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Erase_Test<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  iterator f;
  iterator l;
  bool bVar1;
  pointer ppVar2;
  pointer ppVar3;
  long lVar4;
  char *expression_text;
  long lVar5;
  AssertHelper *this_00;
  long in_RDI;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  int i;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_;
  iterator it;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  key_type *in_stack_fffffffffffffb18;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb20;
  pointer this_01;
  AssertHelper *this_02;
  uint *in_stack_fffffffffffffb28;
  pointer lhs;
  uint *lhs_00;
  char *in_stack_fffffffffffffb30;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb38;
  int iVar6;
  HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb40;
  Type in_stack_fffffffffffffb4c;
  AssertHelper *in_stack_fffffffffffffb50;
  key_type *in_stack_fffffffffffffb58;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb70;
  pointer in_stack_fffffffffffffb80;
  char *in_stack_fffffffffffffb88;
  AssertionResult *in_stack_fffffffffffffb98;
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffbb0;
  char *in_stack_fffffffffffffbb8;
  char *in_stack_fffffffffffffbd0;
  AssertionResult local_3f0;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined8 local_3a8;
  AssertHelper *local_3a0;
  uint *local_398;
  undefined8 local_388;
  AssertHelper *local_380;
  uint *local_378;
  size_type local_360;
  undefined4 local_354;
  AssertionResult local_350 [3];
  value_type local_318;
  pair<int,_int> local_308;
  int local_300;
  int local_2fc;
  size_type local_2e8;
  undefined4 local_2dc;
  AssertionResult local_2d8;
  dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *local_2c8;
  pointer local_2c0;
  pointer local_2b8;
  string local_2b0 [48];
  iterator local_280;
  undefined1 local_259;
  AssertionResult local_258;
  key_type local_248;
  dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_240 [2];
  size_type local_210;
  undefined4 local_204;
  AssertionResult local_200 [2];
  key_type local_1e0;
  size_type local_1d8;
  undefined4 local_1cc;
  AssertionResult local_1c8 [2];
  size_type local_1a8;
  undefined4 local_19c;
  AssertionResult local_198 [2];
  key_type local_178;
  size_type local_170;
  undefined4 local_164;
  AssertionResult local_160 [2];
  size_type local_140;
  undefined4 local_134;
  AssertionResult local_130 [2];
  key_type local_110;
  size_type local_108;
  undefined4 local_fc;
  AssertionResult local_f8 [3];
  value_type local_c0;
  pair<int,_int> local_ac;
  int local_a4;
  value_type local_78;
  pair<int,_int> local_68;
  int local_60;
  key_type local_38;
  size_type local_30;
  undefined4 local_24;
  AssertionResult local_20;
  key_type local_10;
  
  ppVar2 = (pointer)(in_RDI + 0x10);
  local_10 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  local_24 = 0;
  local_38 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20));
  local_30 = google::
             BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::erase(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (unsigned_long *)in_stack_fffffffffffffb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffbd0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xeb0875);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
    testing::Message::~Message((Message *)0xeb08d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb0949);
  ppVar3 = (pointer)(in_RDI + 0x10);
  local_78 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffb40,
                            (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
  local_60 = local_78.second;
  local_68 = local_78.first;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,(value_type *)in_stack_fffffffffffffb98);
  local_c0 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffb40,
                            (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
  local_ac = local_c0.first;
  local_a4 = local_c0.second;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffba0,(value_type *)in_stack_fffffffffffffb98);
  local_fc = 1;
  lVar4 = in_RDI + 0x10;
  local_110 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20))
  ;
  local_108 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (unsigned_long *)in_stack_fffffffffffffb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_f8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffbb8 =
         testing::AssertionResult::failure_message((AssertionResult *)0xeb0ad2);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
    testing::Message::~Message((Message *)0xeb0b35);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb0ba3);
  local_134 = 1;
  local_140 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb0bbf);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (unsigned_long *)in_stack_fffffffffffffb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffbb0 =
         testing::AssertionResult::failure_message((AssertionResult *)0xeb0c38);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
    testing::Message::~Message((Message *)0xeb0c9b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb0d0c);
  local_164 = 0;
  local_178 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20))
  ;
  local_170 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (unsigned_long *)in_stack_fffffffffffffb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_160);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffba0 =
         (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xeb0dce);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
    testing::Message::~Message((Message *)0xeb0e31);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb0e9f);
  local_19c = 1;
  local_1a8 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb0ebb);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (unsigned_long *)in_stack_fffffffffffffb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb98 =
         (AssertionResult *)testing::AssertionResult::failure_message((AssertionResult *)0xeb0f34);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
    testing::Message::~Message((Message *)0xeb0f97);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb1008);
  local_1cc = 0;
  expression_text = (char *)(in_RDI + 0x10);
  local_1e0 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20))
  ;
  local_1d8 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::erase(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (unsigned_long *)in_stack_fffffffffffffb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb88 =
         testing::AssertionResult::failure_message((AssertionResult *)0xeb10c4);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
    testing::Message::~Message((Message *)0xeb1121);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb118f);
  local_204 = 1;
  local_210 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb11ab);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
             (unsigned_long *)in_stack_fffffffffffffb20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_200);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb80 =
         (pointer)testing::AssertionResult::failure_message((AssertionResult *)0xeb1224);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
    testing::Message::~Message((Message *)0xeb1281);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb12f2);
  lVar5 = in_RDI + 0x10;
  local_248 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffffb38,(int)((ulong)in_stack_fffffffffffffb30 >> 0x20))
  ;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::find(in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffb60);
  local_259 = google::
              dense_hashtable_iterator<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              ::operator!=(local_240,&local_280);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb20,(bool *)in_stack_fffffffffffffb18,
             (type *)0xeb1382);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffb98,expression_text,in_stack_fffffffffffffb88,
               (char *)in_stack_fffffffffffffb80);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
    std::__cxx11::string::~string(local_2b0);
    testing::Message::~Message((Message *)0xeb1455);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb14ec);
  local_2c8 = local_240[0].ht;
  local_2c0 = local_240[0].pos;
  local_2b8 = local_240[0].end;
  it_00.pos = (pointer)lVar5;
  it_00.ht = (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)in_stack_fffffffffffffb70;
  it_00.end = in_stack_fffffffffffffb80;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffb60,it_00);
  local_2dc = 0;
  local_2e8 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb156a);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,(uint *)local_240[0].end,
             (unsigned_long *)local_240[0].pos);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
  this_01 = local_240[0].pos;
  lhs = local_240[0].end;
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    testing::AssertionResult::failure_message((AssertionResult *)0xeb15e3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,(int)((ulong)in_stack_fffffffffffffb38 >> 0x20),in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_240[0].pos);
    testing::Message::~Message((Message *)0xeb1640);
    this_01 = local_240[0].pos;
    lhs = local_240[0].end;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb16b1);
  for (local_2fc = 10; local_2fc < 100; local_2fc = local_2fc + 1) {
    local_318 = HashtableTest<google::HashtableInterface_DenseHashMap<std::pair<int,_int>,_int,_kEmptyIntPair,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffb40,
                               (int)((ulong)in_stack_fffffffffffffb38 >> 0x20));
    local_308 = local_318.first;
    local_300 = local_318.second;
    google::
    BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffffba0,(value_type *)in_stack_fffffffffffffb98);
  }
  local_354 = 0x5a;
  local_360 = google::
              BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xeb1775);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffffb38,in_stack_fffffffffffffb30,(uint *)lhs,
             (unsigned_long *)this_01);
  iVar6 = (int)((ulong)in_stack_fffffffffffffb38 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_350);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    in_stack_fffffffffffffb60 =
         (BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)testing::AssertionResult::failure_message((AssertionResult *)0xeb17dc);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40
               ,iVar6,in_stack_fffffffffffffb30);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
    testing::Message::~Message((Message *)0xeb1839);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb18aa);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffb60);
  local_388 = local_3a8;
  local_380 = local_3a0;
  local_378 = local_398;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffb60);
  local_3c0 = local_3e0;
  local_3b8 = local_3d8;
  local_3b0 = local_3d0;
  f.pos = (pointer)in_stack_fffffffffffffbb8;
  f.ht = (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)in_stack_fffffffffffffbb0;
  f.end = ppVar3;
  l.pos = (pointer)in_stack_fffffffffffffbd0;
  l.ht = (dense_hashtable<std::pair<const_std::pair<int,_int>,_int>,_std::pair<int,_int>,_TransparentHasher,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          *)lVar4;
  l.end = ppVar2;
  this_02 = local_380;
  lhs_00 = local_378;
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::erase(in_stack_fffffffffffffba0,f,l);
  google::
  BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::size((BaseHashtableInterface<google::dense_hash_map<std::pair<int,_int>,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)0xeb19b1);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (local_3d8,local_3e0,lhs_00,(unsigned_long *)this_02);
  iVar6 = (int)((ulong)local_3d8 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb50);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xeb1a2a)
    ;
    testing::internal::AssertHelper::AssertHelper
              (this_00,in_stack_fffffffffffffb4c,local_3d0,iVar6,local_3e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffffba0,(Message *)in_stack_fffffffffffffb98);
    testing::internal::AssertHelper::~AssertHelper(this_02);
    testing::Message::~Message((Message *)0xeb1a87);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xeb1af2);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Erase) {
  this->ht_.set_deleted_key(this->UniqueKey(1));
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  this->ht_.insert(this->UniqueObject(10));
  this->ht_.insert(this->UniqueObject(20));
  EXPECT_EQ(1u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(20)));
  EXPECT_EQ(1u, this->ht_.size());
  EXPECT_EQ(0u, this->ht_.erase(this->UniqueKey(19)));
  EXPECT_EQ(1u, this->ht_.size());

  typename TypeParam::iterator it = this->ht_.find(this->UniqueKey(10));
  EXPECT_TRUE(it != this->ht_.end());
  this->ht_.erase(it);
  EXPECT_EQ(0u, this->ht_.size());

  for (int i = 10; i < 100; i++) this->ht_.insert(this->UniqueObject(i));
  EXPECT_EQ(90u, this->ht_.size());
  this->ht_.erase(this->ht_.begin(), this->ht_.end());
  EXPECT_EQ(0u, this->ht_.size());
}